

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O0

int R_FindSkin(char *name,int pclass)

{
  bool bVar1;
  int iVar2;
  FPlayerClass *this;
  uint local_20;
  uint i;
  int pclass_local;
  char *name_local;
  
  iVar2 = strcasecmp("base",name);
  if (iVar2 != 0) {
    for (local_20 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses); local_20 < numskins;
        local_20 = local_20 + 1) {
      iVar2 = strncasecmp(skins[local_20].name,name,0x10);
      if (iVar2 == 0) {
        this = TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,(long)pclass);
        bVar1 = FPlayerClass::CheckSkin(this,local_20);
        if (!bVar1) {
          return pclass;
        }
        return local_20;
      }
    }
  }
  return pclass;
}

Assistant:

int R_FindSkin (const char *name, int pclass)
{
	if (stricmp ("base", name) == 0)
	{
		return pclass;
	}

	for (unsigned i = PlayerClasses.Size(); i < numskins; i++)
	{
		if (strnicmp (skins[i].name, name, 16) == 0)
		{
			if (PlayerClasses[pclass].CheckSkin (i))
				return i;
			else
				return pclass;
		}
	}
	return pclass;
}